

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O0

char * __thiscall
Memory::
PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
::TryAllocDecommittedPages<true>
          (PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
           *this,uint pageCount,
          PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> **pageSegment)

{
  size_t sVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  undefined4 *puVar8;
  DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_> *node;
  PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *pPVar9;
  char *pcVar10;
  DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount> *toList_00;
  DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount> *toList;
  uint recommitPageCount;
  char *pages;
  uint oldDecommitPageCount;
  uint oldFreePageCount;
  PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *freeSegment;
  EditingIterator i;
  PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> **pageSegment_local;
  uint pageCount_local;
  PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
  *this_local;
  
  i.super_Iterator.current = (NodeBase *)pageSegment;
  uVar4 = (*this->_vptr_PageAllocatorBase[3])();
  if ((uVar4 & 1) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x45c,"(!this->HasMultiThreadAccess())","!this->HasMultiThreadAccess()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 0;
  }
  DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>::
  EditingIterator::EditingIterator((EditingIterator *)&freeSegment,&this->decommitSegments);
  while( true ) {
    if (i.super_Iterator.list ==
        (DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount> *)0x0
       ) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                         ,0x66,"(current != nullptr)","current != nullptr");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 0;
    }
    pPVar9 = freeSegment;
    node = DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>::Next
                     (&(i.super_Iterator.list)->
                       super_DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
                     );
    bVar3 = DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>::
            IsHead((DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>
                    *)pPVar9,node);
    if (bVar3) break;
    i.super_Iterator.list =
         (DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount> *)
         DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>::Next
                   (&(i.super_Iterator.list)->
                     super_DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
                   );
    pPVar9 = DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>::
             Iterator::Data((Iterator *)&freeSegment);
    uVar5 = PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>::GetFreePageCount(pPVar9);
    uVar6 = PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>::GetDecommitPageCount(pPVar9);
    pcVar10 = PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>::DoAllocDecommitPages<true>
                        (pPVar9,pageCount);
    if (pcVar10 != (char *)0x0) {
      sVar1 = this->freePageCount;
      uVar7 = PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>::GetFreePageCount(pPVar9);
      this->freePageCount = (sVar1 - uVar5) + (ulong)uVar7;
      sVar1 = this->decommitPageCount;
      uVar7 = PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>::GetDecommitPageCount(pPVar9);
      this->decommitPageCount = (sVar1 - uVar6) + (ulong)uVar7;
      if (this->freePageCount < this->debugMinFreePageCount) {
        this->debugMinFreePageCount = this->freePageCount;
      }
      uVar6 = PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>::GetFreePageCount(pPVar9);
      LogRecommitPages(this,(ulong)(pageCount - (uVar5 - uVar6)));
      LogAllocPages(this,(ulong)pageCount);
      uVar5 = PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>::GetDecommitPageCount(pPVar9);
      if (uVar5 == 0) {
        toList_00 = GetSegmentList(this,pPVar9);
        DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>::
        EditingIterator::MoveCurrentTo((EditingIterator *)&freeSegment,toList_00);
      }
      ((i.super_Iterator.current)->next).base =
           (DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_> *)pPVar9
      ;
      return pcVar10;
    }
  }
  return (char *)0x0;
}

Assistant:

char *
PageAllocatorBase<TVirtualAlloc, TSegment, TPageSegment>::TryAllocDecommittedPages(uint pageCount, TPageSegment ** pageSegment)
{
    Assert(!this->HasMultiThreadAccess());

    typename DListBase<TPageSegment>::EditingIterator i(&decommitSegments);

    while (i.Next())
    {
        TPageSegment * freeSegment = &i.Data();
        uint oldFreePageCount = freeSegment->GetFreePageCount();
        uint oldDecommitPageCount = freeSegment->GetDecommitPageCount();

        char * pages = freeSegment->template DoAllocDecommitPages<notPageAligned>(pageCount);
        if (pages != nullptr)
        {
            this->freePageCount = this->freePageCount - oldFreePageCount + freeSegment->GetFreePageCount();

#if DBG_DUMP
            this->decommitPageCount = this->decommitPageCount - oldDecommitPageCount + freeSegment->GetDecommitPageCount();
#endif
#if DBG
            UpdateMinimum(this->debugMinFreePageCount, this->freePageCount);
#endif
            uint recommitPageCount = pageCount - (oldFreePageCount - freeSegment->GetFreePageCount());
            LogRecommitPages(recommitPageCount);
            LogAllocPages(pageCount);

            if (freeSegment->GetDecommitPageCount() == 0)
            {
                auto toList = GetSegmentList(freeSegment);
                i.MoveCurrentTo(toList);
            }

            *pageSegment = freeSegment;
            return pages;
        }
    }
    return nullptr;
}